

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_encode_end(aec_stream *strm)

{
  EVP_PKEY_CTX *in_RDI;
  int status;
  internal_state *state;
  int local_14;
  
  local_14 = 0;
  if ((*(int *)(*(long *)(in_RDI + 0x40) + 400) == 1) &&
     (*(int *)(*(long *)(in_RDI + 0x40) + 0x194) == 0)) {
    local_14 = -2;
  }
  cleanup(in_RDI);
  return local_14;
}

Assistant:

int aec_encode_end(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int status;

    status = AEC_OK;
    if (state->flush == AEC_FLUSH && state->flushed == 0)
        status = AEC_STREAM_ERROR;
    cleanup(strm);
    return status;
}